

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O3

int Test_N_VScale(N_Vector X,N_Vector Z,sunindextype param_3,int myid)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  timespec spec;
  timespec local_40;
  
  N_VConst(0x3fe0000000000000);
  clock_gettime(1,&local_40);
  lVar3 = local_40.tv_sec - base_time_tv_sec;
  dVar5 = (double)local_40.tv_nsec;
  N_VScale(0x4000000000000000,X,X);
  sync_device(X);
  clock_gettime(1,&local_40);
  lVar4 = local_40.tv_sec - base_time_tv_sec;
  dVar6 = (double)local_40.tv_nsec;
  iVar1 = check_ans(1.0,X,param_3);
  if (iVar1 == 0) {
    iVar1 = 0;
    if (myid == 0) {
      puts("PASSED test -- N_VScale Case 1 ");
      iVar1 = 0;
    }
  }
  else {
    printf(">>> FAILED test -- N_VScale Case 1, Proc %d \n",(ulong)(uint)myid);
    iVar1 = 1;
  }
  max_time(X,(dVar6 / 1000000000.0 + (double)lVar4) - (dVar5 / 1000000000.0 + (double)lVar3));
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n","N_VScale");
  }
  N_VConst(0xbff0000000000000,X);
  N_VConst(0,Z);
  clock_gettime(1,&local_40);
  lVar3 = local_40.tv_sec - base_time_tv_sec;
  dVar6 = (double)local_40.tv_nsec;
  N_VScale(0x3ff0000000000000,X,Z);
  sync_device(X);
  clock_gettime(1,&local_40);
  lVar4 = local_40.tv_sec - base_time_tv_sec;
  dVar5 = (double)local_40.tv_nsec;
  iVar2 = check_ans(-1.0,Z,param_3);
  if (iVar2 == 0) {
    if (myid == 0) {
      puts("PASSED test -- N_VScale Case 2 ");
    }
  }
  else {
    printf(">>> FAILED test -- N_VScale Case 2, Proc %d \n",(ulong)(uint)myid);
    iVar1 = iVar1 + 1;
  }
  max_time(X,(dVar5 / 1000000000.0 + (double)lVar4) - (dVar6 / 1000000000.0 + (double)lVar3));
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n","N_VScale");
  }
  N_VConst(0xbff0000000000000,X);
  N_VConst(0,Z);
  clock_gettime(1,&local_40);
  lVar3 = local_40.tv_sec - base_time_tv_sec;
  dVar6 = (double)local_40.tv_nsec;
  N_VScale(0xbff0000000000000,X,Z);
  sync_device(X);
  clock_gettime(1,&local_40);
  lVar4 = local_40.tv_sec - base_time_tv_sec;
  dVar5 = (double)local_40.tv_nsec;
  iVar2 = check_ans(1.0,Z,param_3);
  if (iVar2 == 0) {
    if (myid == 0) {
      puts("PASSED test -- N_VScale Case 3 ");
    }
  }
  else {
    printf(">>> FAILED test -- N_VScale Case 3, Proc %d \n",(ulong)(uint)myid);
    iVar1 = iVar1 + 1;
  }
  max_time(X,(dVar5 / 1000000000.0 + (double)lVar4) - (dVar6 / 1000000000.0 + (double)lVar3));
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n","N_VScale");
  }
  N_VConst(0xbfe0000000000000,X);
  N_VConst(0,Z);
  clock_gettime(1,&local_40);
  lVar3 = local_40.tv_sec - base_time_tv_sec;
  dVar5 = (double)local_40.tv_nsec;
  N_VScale(0x4000000000000000,X,Z);
  sync_device(X);
  clock_gettime(1,&local_40);
  lVar4 = local_40.tv_sec - base_time_tv_sec;
  iVar2 = check_ans(-1.0,Z,param_3);
  if (iVar2 == 0) {
    if (myid == 0) {
      puts("PASSED test -- N_VScale Case 4 ");
    }
  }
  else {
    printf(">>> FAILED test -- N_VScale Case 4, Proc %d \n",(ulong)(uint)myid);
    iVar1 = iVar1 + 1;
  }
  max_time(X,((double)local_40.tv_nsec / 1000000000.0 + (double)lVar4) -
             (dVar5 / 1000000000.0 + (double)lVar3));
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n","N_VScale");
  }
  return iVar1;
}

Assistant:

int Test_N_VScale(N_Vector X, N_Vector Z, sunindextype local_length, int myid)
{
  int fails = 0, failure = 0;
  double start_time, stop_time, maxt;

  /*
   * Case 1: x = cx, VScaleBy
   */

  /* fill vector data */
  N_VConst(HALF, X);

  start_time = get_time();
  N_VScale(TWO, X, X);
  sync_device(X);
  stop_time = get_time();

  /* X should be vector of +1 */
  failure = check_ans(ONE, X, local_length);

  if (failure)
  {
    printf(">>> FAILED test -- N_VScale Case 1, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VScale Case 1 \n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VScale", maxt);

  /*
   * Case 2: z = x, VCopy
   */

  /* reset failure */
  failure = 0;

  /* fill vector data */
  N_VConst(NEG_ONE, X);
  N_VConst(ZERO, Z);

  start_time = get_time();
  N_VScale(ONE, X, Z);
  sync_device(X);
  stop_time = get_time();

  /* Z should be vector of -1 */
  failure = check_ans(NEG_ONE, Z, local_length);

  if (failure)
  {
    printf(">>> FAILED test -- N_VScale Case 2, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VScale Case 2 \n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VScale", maxt);

  /*
   * Case 3: z = -x, VNeg
   */

  /* reset failure */
  failure = 0;

  /* fill vector data */
  N_VConst(NEG_ONE, X);
  N_VConst(ZERO, Z);

  start_time = get_time();
  N_VScale(NEG_ONE, X, Z);
  sync_device(X);
  stop_time = get_time();

  /* Z should be vector of +1 */
  failure = check_ans(ONE, Z, local_length);

  if (failure)
  {
    printf(">>> FAILED test -- N_VScale Case 3, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VScale Case 3 \n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VScale", maxt);

  /*
   * Case 4: z = cx, All other cases
   */

  /* reset failure */
  failure = 0;

  /* fill vector data */
  N_VConst(NEG_HALF, X);
  N_VConst(ZERO, Z);

  start_time = get_time();
  N_VScale(TWO, X, Z);
  sync_device(X);
  stop_time = get_time();

  /* Z should be vector of -1 */
  failure = check_ans(NEG_ONE, Z, local_length);

  if (failure)
  {
    printf(">>> FAILED test -- N_VScale Case 4, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VScale Case 4 \n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VScale", maxt);

  return (fails);
}